

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count.cpp
# Opt level: O1

AggregateFunctionSet * duckdb::CountFun::GetFunctions(void)

{
  vector<duckdb::AggregateFunction,_true> *this;
  long lVar1;
  undefined8 *puVar2;
  AggregateFunctionSet *in_RDI;
  aggregate_size_t *pp_Var3;
  byte bVar4;
  AggregateFunction count_function;
  string local_3d0;
  AggregateFunction local_3b0;
  BaseScalarFunction local_280;
  undefined8 auStack_1d0 [10];
  code *local_180;
  AggregateOrderDependent local_168;
  AggregateDistinctDependent AStack_167;
  element_type *local_160;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_158;
  AggregateFunction local_150;
  
  bVar4 = 0;
  CountFunctionBase::GetFunction();
  local_180 = CountPropagateStats;
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"count","");
  AggregateFunctionSet::AggregateFunctionSet(in_RDI,&local_3d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_3b0,&local_280.super_SimpleFunction);
  local_3b0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_02474b40;
  LogicalType::LogicalType(&local_3b0.super_BaseScalarFunction.return_type,&local_280.return_type);
  local_3b0.super_BaseScalarFunction.stability = local_280.stability;
  local_3b0.super_BaseScalarFunction.null_handling = local_280.null_handling;
  local_3b0.super_BaseScalarFunction.errors = local_280.errors;
  local_3b0.super_BaseScalarFunction.collation_handling = local_280.collation_handling;
  local_3b0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02477a08;
  puVar2 = auStack_1d0;
  pp_Var3 = &local_3b0.state_size;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pp_Var3 = (aggregate_size_t)*puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    pp_Var3 = pp_Var3 + (ulong)bVar4 * -2 + 1;
  }
  local_3b0.order_dependent = local_168;
  local_3b0.distinct_dependent = AStack_167;
  local_3b0.function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_160;
  local_3b0.function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_158;
  if (local_158 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_158->_M_use_count = local_158->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_158->_M_use_count = local_158->_M_use_count + 1;
    }
  }
  this = &(in_RDI->super_FunctionSet<duckdb::AggregateFunction>).functions;
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_3b0);
  local_3b0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02477a08;
  if (local_3b0.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3b0.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_3b0.super_BaseScalarFunction);
  CountStarFun::GetFunction();
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_150);
  local_150.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02477a08;
  if (local_150.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_150.super_BaseScalarFunction);
  local_280.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02477a08;
  if (local_158 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_158);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_280);
  return in_RDI;
}

Assistant:

AggregateFunctionSet CountFun::GetFunctions() {
	AggregateFunction count_function = CountFunctionBase::GetFunction();
	count_function.statistics = CountPropagateStats;
	AggregateFunctionSet count("count");
	count.AddFunction(count_function);
	// the count function can also be called without arguments
	count.AddFunction(CountStarFun::GetFunction());
	return count;
}